

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::detail::
assert_value_eq<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,get_result *result,value_view expected)

{
  iter_difference_t<const_std::byte_*> __d1;
  pointer pbVar1;
  char *in_R9;
  string local_48;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  AssertHelper local_10;
  
  if (this[0x10] == (detail)0x0) {
    __assert_fail("result.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                  ,99,
                  "void unodb::test::detail::assert_value_eq(const typename Db::get_result &, unodb::value_view) [Db = unodb::db<unodb::key_view, unodb::value_view>]"
                 );
  }
  if (*(pointer *)(this + 8) == expected._M_ptr) {
    if (expected._M_ptr != (pointer)0x0) {
      pbVar1 = (pointer)0x0;
      do {
        if (pbVar1[*(long *)this] !=
            pbVar1[(long)&result->
                          super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                  ]) goto LAB_00237a9c;
        pbVar1 = pbVar1 + 1;
      } while (*(pointer *)(this + 8) != pbVar1);
    }
  }
  else {
LAB_00237a9c:
    local_28[0] = (internal)0x0;
    local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,local_28,(AssertionResult *)"std::ranges::equal(*result, expected)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_10,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,100,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_10,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (local_18._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_18._M_head_impl + 8))();
    }
    if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_20,local_20);
    }
  }
  return;
}

Assistant:

void assert_value_eq(const typename Db::get_result &result,
                     unodb::value_view expected) noexcept {
  if constexpr (is_mutex_db<Db>) {
    UNODB_DETAIL_ASSERT(result.second.owns_lock());
    UNODB_DETAIL_ASSERT(result.first.has_value());
    UNODB_ASSERT_TRUE(std::ranges::equal(*result.first, expected));
  } else {
    UNODB_DETAIL_ASSERT(result.has_value());
    UNODB_ASSERT_TRUE(std::ranges::equal(*result, expected));
  }
}